

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

FExecList * C_ParseCmdLineParams(FExecList *exec)

{
  FString FVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  FString cmdString;
  FString local_48;
  char *local_40;
  FString local_38;
  
  iVar2 = DArgs::NumArgs(Args);
  if (1 < iVar2) {
    iVar2 = 1;
    local_40 = FString::NullString.Nothing;
    do {
      pcVar5 = DArgs::GetArg(Args,iVar2);
      if (*pcVar5 == '+') {
        local_48.Chars = local_40;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        uVar6 = 1;
        while( true ) {
          iVar3 = DArgs::NumArgs(Args);
          iVar4 = iVar2 + uVar6;
          if (iVar3 <= iVar4) break;
          pcVar5 = DArgs::GetArg(Args,iVar4);
          if (*pcVar5 == '-') break;
          pcVar5 = DArgs::GetArg(Args,iVar4);
          if (*pcVar5 == '+') break;
          uVar6 = uVar6 + 1;
        }
        DArgs::GetArgList(Args,iVar2);
        BuildString((int)&local_38,(FString *)(ulong)uVar6);
        FString::operator=(&local_48,&local_38);
        FString::~FString(&local_38);
        FVar1.Chars = local_48.Chars;
        if (((FNullStringData *)(local_48.Chars + -0xc))->Len != 0) {
          if (exec == (FExecList *)0x0) {
            exec = (FExecList *)operator_new(0x20);
            (exec->Pullins).Array = (FString *)0x0;
            (exec->Pullins).Most = 0;
            (exec->Pullins).Count = 0;
            (exec->Commands).Array = (FString *)0x0;
            (exec->Commands).Most = 0;
            (exec->Commands).Count = 0;
          }
          FExecList::AddCommand(exec,FVar1.Chars + 1,(char *)0x0);
        }
        FString::~FString(&local_48);
        iVar2 = iVar4;
      }
      else {
        iVar2 = iVar2 + 1;
      }
      iVar4 = DArgs::NumArgs(Args);
    } while (iVar2 < iVar4);
  }
  return exec;
}

Assistant:

FExecList *C_ParseCmdLineParams(FExecList *exec)
{
	for (int currArg = 1; currArg < Args->NumArgs(); )
	{
		if (*Args->GetArg (currArg++) == '+')
		{
			FString cmdString;
			int cmdlen = 1;
			int argstart = currArg - 1;

			while (currArg < Args->NumArgs())
			{
				if (*Args->GetArg (currArg) == '-' || *Args->GetArg (currArg) == '+')
					break;
				currArg++;
				cmdlen++;
			}

			cmdString = BuildString (cmdlen, Args->GetArgList (argstart));
			if (!cmdString.IsEmpty())
			{
				if (exec == NULL)
				{
					exec = new FExecList;
				}
				exec->AddCommand(&cmdString[1]);
			}
		}
	}
	return exec;
}